

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int print_gau_cnt(char *fn)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  vector_t ***wt_var;
  uint32 *veclen;
  vector_t ***wt_mean;
  int32 pass2var;
  float32 ***dnom;
  char mv_fmt [64];
  
  iVar1 = s3gaucnt_read(fn,&wt_mean,&wt_var,&pass2var,&dnom,&n_mgau,&n_feat,&n_density,&veclen);
  if (iVar1 == 0) {
    if (wt_var == (vector_t ***)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x137,"No variance counts\n");
    }
    if (pass2var != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x13a,"-2passvar yes\n");
    }
    cmdln = cmd_ln_get();
    lVar2 = cmd_ln_int_r(cmdln,"-sigfig");
    sprintf(mv_fmt,"%%.%de,%%.%de ",(ulong)((int)lVar2 - 1));
    if (n_mgau != 0) {
      uVar4 = 0;
      do {
        printf("mgau %u\n",uVar4 & 0xffffffff);
        if (n_feat != 0) {
          uVar3 = 0;
          do {
            printf("feature %u\n",uVar3 & 0xffffffff);
            if (n_density != 0) {
              uVar5 = 0;
              do {
                printf("density %u: ",uVar5 & 0xffffffff);
                printf(e_fmt,(double)(float)dnom[uVar4][uVar3][uVar5]);
                if (veclen[uVar3] != 0) {
                  uVar6 = 0;
                  do {
                    if (wt_var == (vector_t ***)0x0) {
                      dVar7 = 0.0;
                    }
                    else {
                      dVar7 = (double)wt_var[uVar4][uVar3][uVar5][uVar6];
                    }
                    printf(mv_fmt,(double)wt_mean[uVar4][uVar3][uVar5][uVar6],dVar7);
                    uVar6 = uVar6 + 1;
                  } while (uVar6 < veclen[uVar3]);
                }
                putchar(10);
                uVar5 = uVar5 + 1;
              } while (uVar5 < n_density);
            }
            uVar3 = uVar3 + 1;
          } while (uVar3 < n_feat);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < n_mgau);
    }
    if (wt_mean != (vector_t ***)0x0) {
      ckd_free(***wt_mean);
      ckd_free_3d(wt_mean);
    }
    if (wt_var != (vector_t ***)0x0) {
      ckd_free(***wt_var);
      ckd_free_3d(wt_var);
    }
    ckd_free(veclen);
    iVar1 = 0;
  }
  else {
    print_gau_cnt_cold_1();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_gau_cnt(const char *fn)
{
    vector_t ***wt_mean;
    vector_t ***wt_var;
    float32  ***dnom;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 n_density;
    uint32 *veclen;
    uint32 i, j, k, l;
    int32 pass2var;
    char mv_fmt[64];
    int32 sf;

    if (s3gaucnt_read(fn,
		      &wt_mean,
		      &wt_var,
		      &pass2var,
		      &dnom,
		      &n_mgau,
		      &n_feat,
		      &n_density,
		      &veclen) != S3_SUCCESS) {
	fflush(stdout);
	perror(fn);
	    
	return S3_ERROR;
    }

    if (wt_var == NULL) {
	E_INFO("No variance counts\n");
    }
    if (pass2var) {
	E_INFO("-2passvar yes\n");
    }

    sf = cmd_ln_int32("-sigfig");

    sprintf(mv_fmt, "%%.%de,%%.%de ", sf-1, sf-1);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feature %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %u: ", k);
		
		printf(e_fmt, dnom[i][j][k]);
		for (l = 0; l < veclen[j]; l++) {
		    printf(mv_fmt,
			   wt_mean[i][j][k][l],
			   (wt_var ? wt_var[i][j][k][l] : 0.0));
		}
		printf("\n");
	    }
	}
    }

    if (wt_mean) {
	ckd_free(wt_mean[0][0][0]);
	ckd_free_3d((void ***)wt_mean);
    }

    if (wt_var) {
	ckd_free(wt_var[0][0][0]);
	ckd_free_3d((void ***)wt_var);
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}